

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_dpb_mgr.c
# Opt level: O2

void ihevc_dpb_mgr_reset(dpb_mgr_t *ps_dpb_mgr,buf_mgr_t *ps_buf_mgr)

{
  long lVar1;
  long lVar2;
  
  for (lVar2 = 0x10; lVar2 != 0x410; lVar2 = lVar2 + 0x10) {
    lVar1 = *(long *)((long)(ps_dpb_mgr->as_dpb_info + -1) + lVar2);
    if (*(char *)(lVar1 + 0x1c) != '\0') {
      *(undefined1 *)(lVar1 + 0x1c) = 0;
      *(undefined8 *)((long)ps_dpb_mgr->as_dpb_info + lVar2 + -8) = 0;
      ihevc_buf_mgr_release(ps_buf_mgr,(uint)*(byte *)(lVar1 + 0x1e),2);
      *(undefined8 *)((long)(ps_dpb_mgr->as_dpb_info + -1) + lVar2) = 0;
    }
  }
  ps_dpb_mgr->u1_num_ref_bufs = '\0';
  ps_dpb_mgr->ps_dpb_head = (dpb_info_t *)0x0;
  return;
}

Assistant:

void ihevc_dpb_mgr_reset(dpb_mgr_t *ps_dpb_mgr, buf_mgr_t *ps_buf_mgr)
{
    int i;
    dpb_info_t *ps_dpb_info;

    ps_dpb_info = ps_dpb_mgr->as_dpb_info;

    for(i = 0; i < MAX_DPB_BUFS; i++)
    {
        if(ps_dpb_info[i].ps_pic_buf->u1_used_as_ref)
        {
            ps_dpb_info[i].ps_pic_buf->u1_used_as_ref = UNUSED_FOR_REF;
            ps_dpb_info[i].ps_prev_dpb = NULL;
            //Release physical buffer
            ihevc_buf_mgr_release(ps_buf_mgr, ps_dpb_info[i].ps_pic_buf->u1_buf_id,
                                  BUF_MGR_REF);

            ps_dpb_info[i].ps_pic_buf = NULL;
        }
    }
    ps_dpb_mgr->u1_num_ref_bufs = 0;
    ps_dpb_mgr->ps_dpb_head = NULL;

}